

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O0

void NJDNode_clear(NJDNode *node)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  if (in_RDI[1] != 0) {
    free((void *)in_RDI[1]);
    in_RDI[1] = 0;
  }
  if (in_RDI[2] != 0) {
    free((void *)in_RDI[2]);
    in_RDI[2] = 0;
  }
  if (in_RDI[3] != 0) {
    free((void *)in_RDI[3]);
    in_RDI[3] = 0;
  }
  if (in_RDI[4] != 0) {
    free((void *)in_RDI[4]);
    in_RDI[4] = 0;
  }
  if (in_RDI[5] != 0) {
    free((void *)in_RDI[5]);
    in_RDI[5] = 0;
  }
  if (in_RDI[6] != 0) {
    free((void *)in_RDI[6]);
    in_RDI[6] = 0;
  }
  if (in_RDI[7] != 0) {
    free((void *)in_RDI[7]);
    in_RDI[7] = 0;
  }
  if (in_RDI[8] != 0) {
    free((void *)in_RDI[8]);
    in_RDI[8] = 0;
  }
  if (in_RDI[9] != 0) {
    free((void *)in_RDI[9]);
    in_RDI[9] = 0;
  }
  *(undefined4 *)(in_RDI + 10) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  if (in_RDI[0xb] != 0) {
    free((void *)in_RDI[0xb]);
    in_RDI[0xb] = 0;
  }
  *(undefined4 *)(in_RDI + 0xc) = 0xffffffff;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  return;
}

Assistant:

void NJDNode_clear(NJDNode * node)
{
   if (node->string != NULL) {
      free(node->string);
      node->string = NULL;
   }
   if (node->pos != NULL) {
      free(node->pos);
      node->pos = NULL;
   }
   if (node->pos_group1 != NULL) {
      free(node->pos_group1);
      node->pos_group1 = NULL;
   }
   if (node->pos_group2 != NULL) {
      free(node->pos_group2);
      node->pos_group2 = NULL;
   }
   if (node->pos_group3 != NULL) {
      free(node->pos_group3);
      node->pos_group3 = NULL;
   }
   if (node->ctype != NULL) {
      free(node->ctype);
      node->ctype = NULL;
   }
   if (node->cform != NULL) {
      free(node->cform);
      node->cform = NULL;
   }
   if (node->orig != NULL) {
      free(node->orig);
      node->orig = NULL;
   }
   if (node->read != NULL) {
      free(node->read);
      node->read = NULL;
   }
   if (node->pron != NULL) {
      free(node->pron);
      node->pron = NULL;
   }
   node->acc = 0;
   node->mora_size = 0;
   if (node->chain_rule != NULL) {
      free(node->chain_rule);
      node->chain_rule = NULL;
   }
   node->chain_flag = -1;
   node->prev = NULL;
   node->next = NULL;
}